

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resources.cpp
# Opt level: O0

uint64_t CaDiCaL::current_resident_set_size(void)

{
  __pid_t _Var1;
  int iVar2;
  long lVar3;
  int scanned;
  uint64_t rss;
  uint64_t dummy;
  FILE *file;
  char path [64];
  uint64_t local_78;
  long local_60;
  undefined1 local_58 [8];
  FILE *local_50;
  char local_48 [64];
  uint64_t local_8;
  
  _Var1 = getpid();
  snprintf(local_48,0x40,"/proc/%ld/statm",(long)_Var1);
  local_50 = fopen(local_48,"r");
  if (local_50 == (FILE *)0x0) {
    local_8 = 0;
  }
  else {
    iVar2 = __isoc99_fscanf(local_50,"%lu %lu",local_58,&local_60);
    fclose(local_50);
    if (iVar2 == 2) {
      lVar3 = sysconf(0x1e);
      local_78 = local_60 * lVar3;
    }
    else {
      local_78 = 0;
    }
    local_8 = local_78;
  }
  return local_8;
}

Assistant:

uint64_t current_resident_set_size () {
  char path[64];
  snprintf (path, sizeof path, "/proc/%" PRId64 "/statm",
            (int64_t) getpid ());
  FILE *file = fopen (path, "r");
  if (!file)
    return 0;
  uint64_t dummy, rss;
  int scanned = fscanf (file, "%" PRIu64 " %" PRIu64 "", &dummy, &rss);
  fclose (file);
  return scanned == 2 ? rss * sysconf (_SC_PAGESIZE) : 0;
}